

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall glslang::HlslParseContext::finish(HlslParseContext *this)

{
  pointer ptVar1;
  
  ptVar1 = (this->mipsOperatorMipArg).
           super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           .
           super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->mipsOperatorMipArg).
      super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
      .
      super__Vector_base<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
      ._M_impl.super__Vector_impl_data._M_start != ptVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,ptVar1 + -1,"unterminated mips operator:","","");
  }
  removeUnusedStructBufferCounters(this);
  addPatchConstantInvocation(this);
  fixTextureShadowModes(this);
  finalizeAppendMethods(this);
  if ((((this->super_TParseContextBase).super_TParseVersions.intermediate)->needToLegalize == true)
     && (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslLegalization) !=
         EShMsgDefault)) {
    TInfoSinkBase::append
              (&((this->super_TParseContextBase).super_TParseVersions.infoSink)->info,
               "WARNING: AST will form illegal SPIR-V; need to transform to legalize");
  }
  TParseContextBase::finish(&this->super_TParseContextBase);
  return;
}

Assistant:

void HlslParseContext::finish()
{
    // Error check: There was a dangling .mips operator.  These are not nested constructs in the grammar, so
    // cannot be detected there.  This is not strictly needed in a non-validating parser; it's just helpful.
    if (! mipsOperatorMipArg.empty()) {
        error(mipsOperatorMipArg.back().loc, "unterminated mips operator:", "", "");
    }

    removeUnusedStructBufferCounters();
    addPatchConstantInvocation();
    fixTextureShadowModes();
    finalizeAppendMethods();

    // Communicate out (esp. for command line) that we formed AST that will make
    // illegal AST SPIR-V and it needs transforms to legalize it.
    if (intermediate.needsLegalization() && (messages & EShMsgHlslLegalization))
        infoSink.info << "WARNING: AST will form illegal SPIR-V; need to transform to legalize";

    TParseContextBase::finish();
}